

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

void Abc_ManResubDivsD(Abc_ManRes_t *p,int Required)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long local_40;
  
  p->vDivs2UP0->nSize = 0;
  p->vDivs2UP1->nSize = 0;
  p->vDivs2UN0->nSize = 0;
  p->vDivs2UN1->nSize = 0;
  pVVar7 = p->vDivs1B;
  if (0 < pVVar7->nSize) {
    pvVar2 = (p->pRoot->field_5).pData;
    local_40 = 1;
    lVar11 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar11];
      if ((int)(*(uint *)((long)pvVar3 + 0x14) >> 0xc) <= Required + -2) {
        pVVar7 = p->vDivs1B;
        if (lVar11 + 1 < (long)pVVar7->nSize) {
          lVar4 = *(long *)((long)pvVar3 + 0x38);
          pvVar9 = (void *)((ulong)pvVar3 ^ 1);
          lVar12 = local_40;
          do {
            pvVar5 = pVVar7->pArray[lVar12];
            if ((int)(*(uint *)((long)pvVar5 + 0x14) >> 0xc) <= Required + -2) {
              lVar6 = *(long *)((long)pvVar5 + 0x38);
              pVVar7 = p->vDivs2UP0;
              if (pVVar7->nSize < 500) {
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        ~*(uint *)((long)pvVar2 + uVar10 * 4) &
                        *(uint *)(lVar6 + uVar10 * 4) & *(uint *)(lVar4 + uVar10 * 4)) != 0)
                    goto LAB_00303ac0;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00303ac0:
                if ((uint)uVar10 == uVar1) {
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303b3d;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303b3d:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar3;
                  pVVar7 = p->vDivs2UP1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303bcf;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303bcf:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar5;
                }
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        ~(*(uint *)((long)pvVar2 + uVar10 * 4) | *(uint *)(lVar4 + uVar10 * 4)) &
                        *(uint *)(lVar6 + uVar10 * 4)) != 0) goto LAB_00303c0f;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00303c0f:
                if ((uint)uVar10 == uVar1) {
                  pVVar7 = p->vDivs2UP0;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303c91;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303c91:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar9;
                  pVVar7 = p->vDivs2UP1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303d23;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303d23:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar5;
                }
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        ~(*(uint *)((long)pvVar2 + uVar10 * 4) | *(uint *)(lVar6 + uVar10 * 4)) &
                        *(uint *)(lVar4 + uVar10 * 4)) != 0) goto LAB_00303d63;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00303d63:
                if ((uint)uVar10 == uVar1) {
                  pVVar7 = p->vDivs2UP0;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303de5;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303de5:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar3;
                  pVVar7 = p->vDivs2UP1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303e77;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303e77:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = (void *)((ulong)pvVar5 ^ 1);
                }
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        ~*(uint *)((long)pvVar2 + uVar10 * 4) &
                        (*(uint *)(lVar6 + uVar10 * 4) | *(uint *)(lVar4 + uVar10 * 4))) != 0)
                    goto LAB_00303ec3;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00303ec3:
                if ((uint)uVar10 == uVar1) {
                  pVVar7 = p->vDivs2UP0;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303f45;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303f45:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar9;
                  pVVar7 = p->vDivs2UP1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00303fd7;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00303fd7:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = (void *)((ulong)pvVar5 ^ 1);
                }
              }
              pVVar7 = p->vDivs2UN0;
              if (pVVar7->nSize < 500) {
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        ~(*(uint *)(lVar6 + uVar10 * 4) & *(uint *)(lVar4 + uVar10 * 4)) &
                        *(uint *)((long)pvVar2 + uVar10 * 4)) != 0) goto LAB_00304034;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00304034:
                if ((uint)uVar10 == uVar1) {
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_003040b1;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_003040b1:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar3;
                  pVVar7 = p->vDivs2UN1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00304143;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00304143:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar5;
                }
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        (~*(uint *)(lVar6 + uVar10 * 4) | *(uint *)(lVar4 + uVar10 * 4)) &
                        *(uint *)((long)pvVar2 + uVar10 * 4)) != 0) goto LAB_00304183;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00304183:
                if ((uint)uVar10 == uVar1) {
                  pVVar7 = p->vDivs2UN0;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00304205;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00304205:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar9;
                  pVVar7 = p->vDivs2UN1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00304297;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00304297:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar5;
                }
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        (~*(uint *)(lVar4 + uVar10 * 4) | *(uint *)(lVar6 + uVar10 * 4)) &
                        *(uint *)((long)pvVar2 + uVar10 * 4)) != 0) goto LAB_003042d7;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_003042d7:
                if ((uint)uVar10 == uVar1) {
                  pVVar7 = p->vDivs2UN0;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00304359;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00304359:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar3;
                  pVVar7 = p->vDivs2UN1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_003043eb;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_003043eb:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = (void *)((ulong)pvVar5 ^ 1);
                }
                uVar1 = p->nWords;
                if ((int)uVar1 < 1) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pCareSet[uVar10] &
                        ~(*(uint *)(lVar6 + uVar10 * 4) | *(uint *)(lVar4 + uVar10 * 4)) &
                        *(uint *)((long)pvVar2 + uVar10 * 4)) != 0) goto LAB_00304432;
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                  uVar10 = (ulong)uVar1;
                }
LAB_00304432:
                if ((uint)uVar10 == uVar1) {
                  pVVar7 = p->vDivs2UN0;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_003044b2;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_003044b2:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = pvVar9;
                  pVVar7 = p->vDivs2UN1;
                  uVar1 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00304541;
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                      }
                      pVVar7->pArray = ppvVar8;
                    }
                    pVVar7->nCap = iVar13;
                  }
LAB_00304541:
                  iVar13 = pVVar7->nSize;
                  pVVar7->nSize = iVar13 + 1;
                  pVVar7->pArray[iVar13] = (void *)((ulong)pvVar5 ^ 1);
                }
              }
            }
            lVar12 = lVar12 + 1;
            pVVar7 = p->vDivs1B;
          } while ((int)lVar12 < pVVar7->nSize);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar7 = p->vDivs1B;
      local_40 = local_40 + 1;
    } while (lVar11 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Abc_ManResubDivsD( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1;
    unsigned * puData0, * puData1, * puDataR;
    int i, k, w;
    Vec_PtrClear( p->vDivs2UP0 );
    Vec_PtrClear( p->vDivs2UP1 );
    Vec_PtrClear( p->vDivs2UN0 );
    Vec_PtrClear( p->vDivs2UN1 );
    puDataR = (unsigned *)p->pRoot->pData;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1B, pObj0, i )
    {
        if ( (int)pObj0->Level > Required - 2 )
            continue;

        puData0 = (unsigned *)pObj0->pData;
        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs1B, pObj1, k, i + 1 )
        {
            if ( (int)pObj1->Level > Required - 2 )
                continue;

            puData1 = (unsigned *)pObj1->pData;

            if ( Vec_PtrSize(p->vDivs2UP0) < ABC_RS_DIV2_MAX )
            {
                // get positive unate divisors
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] & puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] & puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, pObj0 );
                    Vec_PtrPush( p->vDivs2UP1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (~puData0[w] & puData1[w]) & ~puDataR[w] )
                    if ( (~puData0[w] & puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UP1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] & ~puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] & ~puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, pObj0 );
                    Vec_PtrPush( p->vDivs2UP1, Abc_ObjNot(pObj1) );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] | puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] | puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UP1, Abc_ObjNot(pObj1) );
                }
            }

            if ( Vec_PtrSize(p->vDivs2UN0) < ABC_RS_DIV2_MAX )
            {
                // get negative unate divisors
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] & puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] & puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, pObj0 );
                    Vec_PtrPush( p->vDivs2UN1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(~puData0[w] & puData1[w]) & puDataR[w] )
                    if ( ~(~puData0[w] & puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UN1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] & ~puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] & ~puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, pObj0 );
                    Vec_PtrPush( p->vDivs2UN1, Abc_ObjNot(pObj1) );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] | puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] | puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UN1, Abc_ObjNot(pObj1) );
                }
            }
        }
    }
//    printf( "%d %d  ", Vec_PtrSize(p->vDivs2UP0), Vec_PtrSize(p->vDivs2UN0) );
}